

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstraintsGroup.cpp
# Opt level: O0

bool __thiscall
iDynTree::optimalcontrol::ConstraintsGroup::removeConstraint(ConstraintsGroup *this,string *name)

{
  __type _Var1;
  size_type sVar2;
  ostream *poVar3;
  char *pcVar4;
  __shared_ptr<iDynTree::optimalcontrol::TimedConstraint,_(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *this_01;
  iterator iVar5;
  iterator iVar6;
  string *in_RSI;
  long *in_RDI;
  ostringstream errorMsg_1;
  iterator it;
  bool found;
  ostringstream errorMsg;
  key_type *in_stack_fffffffffffffc18;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>_>_>
  *in_stack_fffffffffffffc20;
  vector<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>,_std::allocator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>_>
  *in_stack_fffffffffffffc30;
  const_iterator in_stack_fffffffffffffc38;
  undefined7 in_stack_fffffffffffffc40;
  undefined1 uVar7;
  string local_380 [32];
  ostringstream local_360 [376];
  shared_ptr<iDynTree::optimalcontrol::TimedConstraint> *local_1e8;
  shared_ptr<iDynTree::optimalcontrol::TimedConstraint> *local_1d8;
  __normal_iterator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_*,_std::vector<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>,_std::allocator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>_>_>
  local_1d0;
  byte local_1c1;
  string local_1c0 [48];
  ostringstream local_190 [376];
  string *local_18;
  byte local_1;
  
  local_18 = in_RSI;
  sVar2 = std::
          unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>_>_>
          ::erase(in_stack_fffffffffffffc20,in_stack_fffffffffffffc18);
  if (sVar2 == 0) {
    std::__cxx11::ostringstream::ostringstream(local_190);
    poVar3 = std::operator<<((ostream *)local_190,"Unable to find constraint named ");
    poVar3 = std::operator<<(poVar3,local_18);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    std::__cxx11::ostringstream::str();
    pcVar4 = (char *)std::__cxx11::string::c_str();
    iDynTree::reportError("ConstraintsGroup","removeConstraint",pcVar4);
    std::__cxx11::string::~string(local_1c0);
    local_1 = 0;
    std::__cxx11::ostringstream::~ostringstream(local_190);
  }
  else {
    local_1c1 = 0;
    local_1d0._M_current =
         (shared_ptr<iDynTree::optimalcontrol::TimedConstraint> *)
         std::
         vector<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>,_std::allocator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>_>
         ::begin((vector<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>,_std::allocator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>_>
                  *)in_stack_fffffffffffffc18);
    while( true ) {
      uVar7 = false;
      if ((local_1c1 & 1) == 0) {
        local_1d8 = (shared_ptr<iDynTree::optimalcontrol::TimedConstraint> *)
                    std::
                    vector<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>,_std::allocator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>_>
                    ::end((vector<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>,_std::allocator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>_>
                           *)in_stack_fffffffffffffc18);
        uVar7 = __gnu_cxx::operator!=
                          ((__normal_iterator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_*,_std::vector<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>,_std::allocator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>_>_>
                            *)in_stack_fffffffffffffc20,
                           (__normal_iterator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_*,_std::vector<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>,_std::allocator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>_>_>
                            *)in_stack_fffffffffffffc18);
      }
      if ((bool)uVar7 == false) break;
      this_00 = &__gnu_cxx::
                 __normal_iterator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_*,_std::vector<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>,_std::allocator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>_>_>
                 ::operator->(&local_1d0)->
                 super___shared_ptr<iDynTree::optimalcontrol::TimedConstraint,_(__gnu_cxx::_Lock_policy)2>
      ;
      std::__shared_ptr<iDynTree::optimalcontrol::TimedConstraint,_(__gnu_cxx::_Lock_policy)2>::get
                (this_00);
      this_01 = std::
                __shared_ptr_access<iDynTree::optimalcontrol::Constraint,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::Constraint,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)0x39676d);
      Constraint::name_abi_cxx11_(this_01);
      _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT17(uVar7,in_stack_fffffffffffffc40),
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_fffffffffffffc38._M_current);
      if (_Var1) {
        in_stack_fffffffffffffc38._M_current =
             (shared_ptr<iDynTree::optimalcontrol::TimedConstraint> *)(*in_RDI + 0x38);
        __gnu_cxx::
        __normal_iterator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>const*,std::vector<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>,std::allocator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>>>>
        ::__normal_iterator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>*>
                  ((__normal_iterator<const_std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_*,_std::vector<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>,_std::allocator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>_>_>
                    *)in_stack_fffffffffffffc20,
                   (__normal_iterator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_*,_std::vector<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>,_std::allocator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>_>_>
                    *)in_stack_fffffffffffffc18);
        local_1e8 = (shared_ptr<iDynTree::optimalcontrol::TimedConstraint> *)
                    std::
                    vector<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>,_std::allocator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>_>
                    ::erase(in_stack_fffffffffffffc30,in_stack_fffffffffffffc38);
        local_1c1 = 1;
      }
      else {
        __gnu_cxx::
        __normal_iterator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_*,_std::vector<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>,_std::allocator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>_>_>
        ::operator++(&local_1d0);
      }
    }
    if ((local_1c1 & 1) == 0) {
      std::__cxx11::ostringstream::ostringstream(local_360);
      poVar3 = std::operator<<((ostream *)local_360,"Unable to find constraint named ");
      poVar3 = std::operator<<(poVar3,local_18);
      poVar3 = std::operator<<(poVar3,"on the ordered vector. This is most likely a bug.");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      std::__cxx11::ostringstream::str();
      pcVar4 = (char *)std::__cxx11::string::c_str();
      iDynTree::reportError("ConstraintsGroup","removeConstraint",pcVar4);
      std::__cxx11::string::~string(local_380);
      local_1 = 0;
      std::__cxx11::ostringstream::~ostringstream(local_360);
    }
    else {
      iVar5 = std::
              vector<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>,_std::allocator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>_>
              ::begin((vector<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>,_std::allocator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>_>
                       *)in_stack_fffffffffffffc18);
      iVar6 = std::
              vector<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>,_std::allocator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>_>
              ::end((vector<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>,_std::allocator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>_>
                     *)in_stack_fffffffffffffc18);
      std::
      sort<__gnu_cxx::__normal_iterator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>*,std::vector<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>,std::allocator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>>>>,iDynTree::optimalcontrol::ConstraintsGroup::removeConstraint(std::__cxx11::string_const&)::__0>
                (iVar5._M_current,iVar6._M_current);
      local_1 = 1;
    }
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool ConstraintsGroup::removeConstraint(const std::string& name)
        {
            if (!(m_pimpl->group.erase(name))) {
                std::ostringstream errorMsg;
                errorMsg << "Unable to find constraint named "<<name<< std::endl;
                reportError("ConstraintsGroup", "removeConstraint", errorMsg.str().c_str());
                return false;
            }

            bool found = false;
            std::vector<TimedConstraint_ptr>::iterator it = m_pimpl->orderedIntervals.begin();
            while ((!found) && (it != m_pimpl->orderedIntervals.end())){
                if (it->get()->constraint->name() == name) {
                    m_pimpl->orderedIntervals.erase(it);
                    found = true;
                } else {
                    ++it;
                }
            }

            if (!found) {
                std::ostringstream errorMsg;
                errorMsg << "Unable to find constraint named "<<name<< "on the ordered vector. This is most likely a bug." << std::endl;
                reportError("ConstraintsGroup", "removeConstraint", errorMsg.str().c_str());
                return false;
            }

            std::sort(m_pimpl->orderedIntervals.begin(), m_pimpl->orderedIntervals.end(), [](const TimedConstraint_ptr&a, const TimedConstraint_ptr&b) { return a->timeRange < b->timeRange;}); //reorder the vector
            return true;
        }